

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void TableSettingsInit(ImGuiTableSettings *settings,ImGuiID id,int columns_count,
                      int columns_count_max)

{
  ImGuiTableSettings *this;
  int iVar1;
  bool bVar2;
  
  settings->ID = 0;
  settings->SaveFlags = 0;
  settings->RefScale = 0.0;
  settings->ColumnsCount = '\0';
  settings->ColumnsCountMax = '\0';
  settings->WantApply = false;
  settings->field_0xf = 0;
  this = settings + 1;
  iVar1 = 0;
  if (0 < columns_count_max) {
    iVar1 = columns_count_max;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    ImGuiTableColumnSettings::ImGuiTableColumnSettings((ImGuiTableColumnSettings *)this);
    this = (ImGuiTableSettings *)&this->ColumnsCount;
  }
  settings->ID = id;
  settings->ColumnsCount = (ImGuiTableColumnIdx)columns_count;
  settings->ColumnsCountMax = (ImGuiTableColumnIdx)columns_count_max;
  settings->WantApply = true;
  return;
}

Assistant:

static void TableSettingsInit(ImGuiTableSettings* settings, ImGuiID id, int columns_count, int columns_count_max)
{
    IM_PLACEMENT_NEW(settings) ImGuiTableSettings();
    ImGuiTableColumnSettings* settings_column = settings->GetColumnSettings();
    for (int n = 0; n < columns_count_max; n++, settings_column++)
        IM_PLACEMENT_NEW(settings_column) ImGuiTableColumnSettings();
    settings->ID = id;
    settings->ColumnsCount = (ImGuiTableColumnIdx)columns_count;
    settings->ColumnsCountMax = (ImGuiTableColumnIdx)columns_count_max;
    settings->WantApply = true;
}